

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QScreen * __thiscall QWidget::screen(QWidget *this)

{
  bool bVar1;
  QWidget *this_00;
  QTLWExtra *pQVar2;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QScreen *screenByPos;
  QTLWExtra *topData;
  QWidget *topLevel;
  QScreen *associatedScreen;
  QWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  QRect *local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x360f0a);
  local_18 = (QRect *)QWidgetPrivate::associatedScreen(in_stack_ffffffffffffffb8);
  if (local_18 != (QRect *)0x0) goto LAB_00360fe6;
  this_00 = window(in_stack_ffffffffffffffc0);
  if (this_00 != (QWidget *)0x0) {
    qt_widget_private((QWidget *)0x360f5a);
    pQVar2 = QWidgetPrivate::topData(in_RDI);
    if ((pQVar2 != (QTLWExtra *)0x0) &&
       (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QScreen> *)0x360f80), bVar1)) {
      local_18 = (QRect *)::QPointer::operator_cast_to_QScreen_((QPointer<QScreen> *)0x360f97);
      goto LAB_00360fe6;
    }
    geometry(this_00);
    local_10 = QRect::center(local_18);
    local_18 = (QRect *)QGuiApplication::screenAt((QPoint *)&local_10);
    if (local_18 != (QRect *)0x0) goto LAB_00360fe6;
  }
  local_18 = (QRect *)QGuiApplication::primaryScreen();
LAB_00360fe6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QScreen *)local_18;
}

Assistant:

QScreen *QWidget::screen() const
{
    Q_D(const QWidget);
    if (auto associatedScreen = d->associatedScreen())
        return associatedScreen;
    if (auto topLevel = window()) {
        if (auto topData = qt_widget_private(topLevel)->topData()) {
            if (topData->initialScreen)
                return topData->initialScreen;
        }
        if (auto screenByPos = QGuiApplication::screenAt(topLevel->geometry().center()))
            return screenByPos;
    }
    return QGuiApplication::primaryScreen();
}